

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

void __thiscall gui::Callback<gui::Widget_*>::~Callback(Callback<gui::Widget_*> *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x20) == 0) {
    std::function<void_(gui::Widget_*)>::~function((function<void_(gui::Widget_*)> *)0x22efa3);
  }
  else {
    std::function<void_()>::~function((function<void_()> *)0x22efaf);
  }
  return;
}

Assistant:

~Callback() {
        if (tag_ == Tag::withArgs) {
            withArgs_.~function();
        } else {
            noArgs_.~function();
        }
    }